

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O3

int log_aspect_notify_first
              (log_aspect aspect,log_aspect_notify_cb notify_cb,log_aspect_notify_data notify_data)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = aspect->count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (aspect->policies[uVar3] != (log_policy)0x0) {
        iVar1 = (*notify_cb)(aspect,aspect->policies[uVar3],notify_data);
        if (iVar1 == 0) {
          return 0;
        }
        uVar2 = aspect->count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  return 1;
}

Assistant:

int log_aspect_notify_first(log_aspect aspect, log_aspect_notify_cb notify_cb, log_aspect_notify_data notify_data)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (aspect->policies[iterator] != NULL)
		{
			if (notify_cb(aspect, aspect->policies[iterator], notify_data) == 0)
			{
				return 0;
			}
		}
	}

	return 1;
}